

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_profile_aa.cpp
# Opt level: O2

void __thiscall
agg::line_profile_aa::set(line_profile_aa *this,double center_width,double smoother_width)

{
  line_profile_aa lVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  int iVar4;
  ulong uVar5;
  line_profile_aa *plVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  
  auVar16._8_8_ = smoother_width;
  auVar16._0_8_ = center_width;
  auVar12._8_8_ = -(ulong)(smoother_width == 0.0);
  auVar12._0_8_ = -(ulong)(center_width == 0.0);
  dVar15 = *(double *)(this + 0x118);
  auVar16 = blendvpd(auVar16,_DAT_001274b0,auVar12);
  dVar13 = auVar16._0_8_ + auVar16._8_8_;
  dVar14 = dVar13 / dVar15;
  auVar10._8_8_ = dVar14;
  auVar10._0_8_ = dVar14;
  auVar12 = divpd(auVar16,auVar10);
  if (dVar15 <= dVar13) {
    dVar14 = 1.0;
  }
  auVar11._0_8_ = (ulong)(uint)(dVar13 < dVar15) << 0x3f;
  auVar11._8_8_ = (ulong)(uint)(dVar13 < dVar15) << 0x3f;
  auVar12 = blendvpd(auVar16,auVar12,auVar11);
  pvVar2 = profile(this,auVar12._0_8_ + auVar12._8_8_);
  uVar5 = (ulong)(auVar12._0_8_ * 256.0);
  lVar1 = this[((long)(dVar14 * 255.0) & 0xffffffffU) + 0x10];
  for (lVar7 = 0; iVar4 = (int)uVar5, iVar4 != (int)lVar7; lVar7 = lVar7 + 1) {
    *(line_profile_aa *)(pvVar2 + lVar7 + 0x200) = lVar1;
  }
  uVar8 = (ulong)(auVar12._8_8_ * 256.0);
  plVar6 = (line_profile_aa *)(pvVar2 + (uVar5 & 0xffffffff) + 0x200);
  dVar15 = 0.0;
  uVar5 = uVar8 & 0xffffffff;
  while (iVar9 = (int)uVar5, uVar5 = (ulong)(iVar9 - 1), iVar9 != 0) {
    *plVar6 = this[((long)(((dVar15 / (double)(uVar8 & 0xffffffff)) * -dVar14 + dVar14) * 255.0) &
                   0xffffffffU) + 0x10];
    plVar6 = plVar6 + 1;
    dVar15 = dVar15 + 1.0;
  }
  iVar9 = *(int *)(this + 8);
  lVar1 = this[0x10];
  for (lVar7 = 0; (iVar9 - (iVar4 + (int)uVar8)) + -0x200 != (int)lVar7; lVar7 = lVar7 + 1) {
    plVar6[lVar7] = lVar1;
  }
  pvVar3 = pvVar2 + 0x1ff;
  for (lVar7 = 0; (int)lVar7 != 0x200; lVar7 = lVar7 + 1) {
    *pvVar3 = pvVar2[lVar7 + 0x200];
    pvVar3 = pvVar3 + -1;
  }
  return;
}

Assistant:

void line_profile_aa::set(double center_width, double smoother_width)
    {
        double base_val = 1.0;
        if(center_width == 0.0)   center_width = 1.0 / subpixel_scale;
        if(smoother_width == 0.0) smoother_width = 1.0 / subpixel_scale;

        double width = center_width + smoother_width;
        if(width < m_min_width)
        {
            double k = width / m_min_width;
            base_val *= k;
            center_width /= k;
            smoother_width /= k;
        }

        value_type* ch = profile(center_width + smoother_width);

        unsigned subpixel_center_width = unsigned(center_width * subpixel_scale);
        unsigned subpixel_smoother_width = unsigned(smoother_width * subpixel_scale);

        value_type* ch_center   = ch + subpixel_scale*2;
        value_type* ch_smoother = ch_center + subpixel_center_width;

        unsigned i;

        unsigned val = m_gamma[unsigned(base_val * aa_mask)];
        ch = ch_center;
        for(i = 0; i < subpixel_center_width; i++)
        {
            *ch++ = (value_type)val;
        }

        for(i = 0; i < subpixel_smoother_width; i++)
        {
            *ch_smoother++ = 
                m_gamma[unsigned((base_val - 
                                  base_val * 
                                  (double(i) / subpixel_smoother_width)) * aa_mask)];
        }

        unsigned n_smoother = profile_size() - 
                              subpixel_smoother_width - 
                              subpixel_center_width - 
                              subpixel_scale*2;

        val = m_gamma[0];
        for(i = 0; i < n_smoother; i++)
        {
            *ch_smoother++ = (value_type)val;
        }

        ch = ch_center;
        for(i = 0; i < subpixel_scale*2; i++)
        {
            *--ch = *ch_center++;
        }
    }